

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall
QTipLabel::QTipLabel(QTipLabel *this,QString *text,QPoint *pos,QWidget *w,int msecDisplayTime)

{
  QStyle *pQVar1;
  QCoreApplication *pQVar2;
  undefined8 in_RCX;
  QTipLabel *in_RDI;
  long in_FS_OFFSET;
  qreal in_stack_00000008;
  undefined4 in_stack_ffffffffffffff78;
  AlignmentFlag in_stack_ffffffffffffff7c;
  undefined1 enable;
  QWidget *in_stack_ffffffffffffff80;
  QWidget *this_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int style;
  QPalette *in_stack_ffffffffffffff90;
  QLabel *this_01;
  undefined4 in_stack_ffffffffffffff98;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff9c;
  undefined4 uVar3;
  int msecDisplayTime_00;
  QTipLabel *pQVar4;
  QTipLabel *this_02;
  long local_8;
  
  msecDisplayTime_00 = (int)((ulong)in_RCX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                (enum_type)in_stack_ffffffffffffff80);
  QLabel::QLabel((QLabel *)in_stack_ffffffffffffff90,
                 (QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (WindowFlags)in_stack_ffffffffffffff9c.i);
  *(undefined ***)&(in_RDI->super_QLabel).super_QFrame.super_QWidget = &PTR_metaObject_00d0d6c8;
  *(undefined ***)&(in_RDI->super_QLabel).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QTipLabel_00d0d880;
  QBasicTimer::QBasicTimer(&in_RDI->hideTimer);
  QBasicTimer::QBasicTimer(&in_RDI->expireTimer);
  in_RDI->styleSheetParent = (QWidget *)0x0;
  in_RDI->widget = (QWidget *)0x0;
  QRect::QRect((QRect *)in_stack_ffffffffffffff80);
  pQVar4 = in_RDI;
  this_02 = instance;
  if (instance != (QTipLabel *)0x0) {
    (**(code **)(*(long *)&(instance->super_QLabel).super_QFrame.super_QWidget + 0x20))();
    pQVar4 = in_RDI;
    this_02 = instance;
  }
  instance = pQVar4;
  pQVar4 = instance;
  QWidget::setForegroundRole(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  QWidget::setBackgroundRole(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  this_00 = (QWidget *)&stack0xffffffffffffffe8;
  QToolTip::palette();
  QWidget::setPalette((QWidget *)CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90);
  QPalette::~QPalette((QPalette *)this_00);
  QWidget::ensurePolished((QWidget *)pQVar4);
  pQVar1 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  style = 0;
  this_01 = (QLabel *)0x0;
  (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x42,0,pQVar4);
  QLabel::setMargin((QLabel *)this_00,in_stack_ffffffffffffff7c);
  QFrame::setFrameStyle(&this_01->super_QFrame,style);
  uVar3 = 1;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)this_00,in_stack_ffffffffffffff7c);
  QLabel::setAlignment
            (this_01,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)pQVar4 >> 0x20,0));
  QLabel::setIndent((QLabel *)this_00,in_stack_ffffffffffffff7c);
  pQVar2 = QCoreApplication::instance();
  QObject::installEventFilter((QObject *)pQVar2);
  pQVar1 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  enable = (undefined1)(in_stack_ffffffffffffff7c >> 0x18);
  (**(code **)(*(long *)pQVar1 + 0xf0))(pQVar1,0x2e,this_01,pQVar4);
  QWidget::setWindowOpacity((QWidget *)this_02,in_stack_00000008);
  QWidget::setMouseTracking(this_00,(bool)enable);
  pQVar4->fadingOut = false;
  reuseTip(this_02,(QString *)pQVar4,msecDisplayTime_00,
           (QPoint *)CONCAT44(uVar3,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTipLabel::QTipLabel(const QString &text, const QPoint &pos, QWidget *w, int msecDisplayTime)
    : QLabel(w, Qt::ToolTip | Qt::BypassGraphicsProxyWidget)
#ifndef QT_NO_STYLE_STYLESHEET
    , styleSheetParent(nullptr)
#endif
    , widget(nullptr)
{
    delete instance;
    instance = this;
    setForegroundRole(QPalette::ToolTipText);
    setBackgroundRole(QPalette::ToolTipBase);
    setPalette(QToolTip::palette());
    ensurePolished();
    setMargin(1 + style()->pixelMetric(QStyle::PM_ToolTipLabelFrameWidth, nullptr, this));
    setFrameStyle(QFrame::NoFrame);
    setAlignment(Qt::AlignLeft);
    setIndent(1);
    qApp->installEventFilter(this);
    setWindowOpacity(style()->styleHint(QStyle::SH_ToolTipLabel_Opacity, nullptr, this) / 255.0);
    setMouseTracking(true);
    fadingOut = false;
    reuseTip(text, msecDisplayTime, pos);
}